

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformpixmap.cpp
# Opt level: O1

void __thiscall
QPlatformPixmap::QPlatformPixmap(QPlatformPixmap *this,PixelType pixelType,int objectId)

{
  this->_vptr_QPlatformPixmap = (_func_int **)&PTR__QPlatformPixmap_007e3a18;
  this->w = 0;
  this->h = 0;
  this->d = 0;
  this->is_null = true;
  this->ref = (QAtomicInteger<int>)0x0;
  this->detach_no = 0;
  this->type = pixelType;
  this->id = objectId;
  this->ser_no = 0;
  this->is_cached = 0;
  return;
}

Assistant:

QPlatformPixmap::QPlatformPixmap(PixelType pixelType, int objectId)
    : w(0),
      h(0),
      d(0),
      is_null(true),
      ref(0),
      detach_no(0),
      type(pixelType),
      id(objectId),
      ser_no(0),
      is_cached(false)
{
}